

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Array4.H
# Opt level: O0

void __thiscall amrex::Array4<const_double>::Array4(Array4<const_double> *this)

{
  Array4<const_double> *this_local;
  
  this->p = (double *)0x0;
  this->jstride = 0;
  this->kstride = 0;
  this->nstride = 0;
  (this->begin).x = 1;
  (this->begin).y = 1;
  (this->begin).z = 1;
  (this->end).x = 0;
  (this->end).y = 0;
  (this->end).z = 0;
  this->ncomp = 0;
  return;
}

Assistant:

AMREX_GPU_HOST_DEVICE
        constexpr Array4 () noexcept : p(nullptr) {}